

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.hh
# Opt level: O3

void std::
     __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Address*,std::vector<Address,std::allocator<Address>>>,__gnu_cxx::__ops::_Val_less_iter>
               (long *__last)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  
  lVar1 = *__last;
  uVar2 = __last[1];
  do {
    lVar3 = __last[-2];
    if (lVar1 == lVar3) {
      if ((ulong)__last[-1] <= uVar2) {
LAB_00292452:
        *__last = lVar1;
        __last[1] = uVar2;
        return;
      }
    }
    else if ((lVar1 != 0) &&
            ((lVar1 == -1 ||
             ((lVar3 != -1 && ((lVar3 == 0 || (*(int *)(lVar3 + 0x60) <= *(int *)(lVar1 + 0x60))))))
             ))) goto LAB_00292452;
    *__last = lVar3;
    __last[1] = __last[-1];
    __last = __last + -2;
  } while( true );
}

Assistant:

inline Address::Address(const Address &op2) {
  base = op2.base;
  offset = op2.offset;
}